

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O0

DWARFCompileUnit * __thiscall
llvm::DWARFContext::getDWOCompileUnitForHash(DWARFContext *this,uint64_t Hash)

{
  bool bVar1;
  DWARFUnit *Val;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *puVar2;
  pointer pDVar3;
  unsigned_long *puVar4;
  ret_type pDVar5;
  Optional<unsigned_long> OVar6;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_d8;
  undefined1 local_d0;
  DWARFDie local_c8;
  Optional<llvm::DWARFFormValue> local_b8;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_80;
  Optional<unsigned_long> DWOId;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *DWOCU;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *__end1;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *__begin1;
  iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>
  *local_38;
  unit_iterator_range *__range1;
  Entry *R;
  DWARFUnitIndex *CUI;
  uint64_t Hash_local;
  DWARFContext *this_local;
  
  CUI = (DWARFUnitIndex *)Hash;
  Hash_local = (uint64_t)this;
  parseDWOUnits(this,true);
  R = (Entry *)getCUIndex(this);
  bVar1 = DWARFUnitIndex::operator_cast_to_bool((DWARFUnitIndex *)R);
  if (bVar1) {
    __range1 = (unit_iterator_range *)DWARFUnitIndex::getFromHash((DWARFUnitIndex *)R,(uint64_t)CUI)
    ;
    if ((Entry *)__range1 == (Entry *)0x0) {
      this_local = (DWARFContext *)0x0;
    }
    else {
      Val = DWARFUnitVector::getUnitForIndexEntry(&this->DWOUnits,(Entry *)__range1);
      this_local = (DWARFContext *)dyn_cast_or_null<llvm::DWARFCompileUnit,llvm::DWARFUnit>(Val);
    }
  }
  else {
    ___begin1 = dwo_compile_units(this);
    local_38 = (iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>
                *)&__begin1;
    __end1 = iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>
             ::begin(local_38);
    puVar2 = iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>
             ::end(local_38);
    for (; __end1 != puVar2; __end1 = __end1 + 1) {
      pDVar3 = std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>::operator->
                         (__end1);
      OVar6 = DWARFUnit::getDWOId(pDVar3);
      DWOId.Storage._8_8_ = OVar6.Storage.field_0;
      bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&DWOId.Storage.hasVal);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_01fdb1d8:
        pDVar3 = std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>::operator->
                           (__end1);
        OVar6 = DWARFUnit::getDWOId(pDVar3);
        local_d8 = OVar6.Storage.field_0;
        local_d0 = OVar6.Storage.hasVal;
        bVar1 = llvm::operator==((Optional<unsigned_long> *)&local_d8,(unsigned_long *)&CUI);
        if (bVar1) {
          pDVar3 = std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>::get
                             (__end1);
          pDVar5 = dyn_cast<llvm::DWARFCompileUnit,llvm::DWARFUnit>(pDVar3);
          return pDVar5;
        }
      }
      else {
        pDVar3 = std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>::operator->
                           (__end1);
        local_c8 = DWARFUnit::getUnitDIE(pDVar3,true);
        DWARFDie::find(&local_b8,&local_c8,DW_AT_GNU_dwo_id);
        OVar6 = dwarf::toUnsigned(&local_b8);
        local_80 = OVar6.Storage.field_0;
        DWOId.Storage.field_0.empty = OVar6.Storage.hasVal;
        bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&local_80.empty);
        if (bVar1) {
          pDVar3 = std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>::
                   operator->(__end1);
          puVar4 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_80);
          DWARFUnit::setDWOId(pDVar3,*puVar4);
          goto LAB_01fdb1d8;
        }
      }
    }
    this_local = (DWARFContext *)0x0;
  }
  return (DWARFCompileUnit *)this_local;
}

Assistant:

DWARFCompileUnit *DWARFContext::getDWOCompileUnitForHash(uint64_t Hash) {
  parseDWOUnits(LazyParse);

  if (const auto &CUI = getCUIndex()) {
    if (const auto *R = CUI.getFromHash(Hash))
      return dyn_cast_or_null<DWARFCompileUnit>(
          DWOUnits.getUnitForIndexEntry(*R));
    return nullptr;
  }

  // If there's no index, just search through the CUs in the DWO - there's
  // probably only one unless this is something like LTO - though an in-process
  // built/cached lookup table could be used in that case to improve repeated
  // lookups of different CUs in the DWO.
  for (const auto &DWOCU : dwo_compile_units()) {
    // Might not have parsed DWO ID yet.
    if (!DWOCU->getDWOId()) {
      if (Optional<uint64_t> DWOId =
          toUnsigned(DWOCU->getUnitDIE().find(DW_AT_GNU_dwo_id)))
        DWOCU->setDWOId(*DWOId);
      else
        // No DWO ID?
        continue;
    }
    if (DWOCU->getDWOId() == Hash)
      return dyn_cast<DWARFCompileUnit>(DWOCU.get());
  }
  return nullptr;
}